

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_ManDfsReverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  bool bVar1;
  int iVar2;
  int local_38;
  int local_30;
  int local_2c;
  int i;
  int iFanout;
  Aig_Obj_t *pFanout;
  Vec_Ptr_t *vNodes_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_2c = -1;
  iVar2 = Aig_IsComplement(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b4,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar2 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 == 0) {
    iVar2 = Aig_ObjIsNode(pObj);
    if ((iVar2 == 0) && (iVar2 = Aig_ObjIsBuf(pObj), iVar2 == 0)) {
      __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x1b7,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if (p->pFanData == (int *)0x0) {
      __assert_fail("p->pFanData",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x1b8,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    local_30 = 0;
    while( true ) {
      bVar1 = false;
      if (local_30 < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
        if (local_30 == 0) {
          local_38 = Aig_ObjFanout0Int(p,pObj->Id);
        }
        else {
          local_38 = Aig_ObjFanoutNext(p,local_2c);
        }
        local_2c = local_38;
        _i = Aig_ManObj(p,local_38 >> 1);
        bVar1 = true;
      }
      if (!bVar1) break;
      Aig_ManDfsReverse_rec(p,_i,vNodes);
      local_30 = local_30 + 1;
    }
    iVar2 = Aig_ObjIsTravIdCurrent(p,pObj);
    if (iVar2 != 0) {
      __assert_fail("!Aig_ObjIsTravIdCurrent(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x1ba,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Aig_ObjSetTravIdCurrent(p,pObj);
    Vec_PtrPush(vNodes,pObj);
  }
  return;
}

Assistant:

void Aig_ManDfsReverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Aig_ManDfsReverse_rec( p, pFanout, vNodes );
    assert( !Aig_ObjIsTravIdCurrent(p, pObj) ); // loop detection
    Aig_ObjSetTravIdCurrent(p, pObj);
    Vec_PtrPush( vNodes, pObj );
}